

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

double extract_ar_row_highbd
                 (int (*coords) [2],int num_coords,uint16_t *data,uint16_t *denoised,int stride,
                 int *sub_log2,uint16_t *alt_data,uint16_t *alt_denoised,int alt_stride,int x,int y,
                 double *buffer)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int x_up;
  int dx_i;
  int y_up;
  int dy_i;
  int num_samples;
  double avg_denoised;
  double avg_data;
  double val;
  int y_i;
  int x_i;
  int i;
  int *sub_log2_local;
  int stride_local;
  uint16_t *denoised_local;
  uint16_t *data_local;
  int num_coords_local;
  int (*coords_local) [2];
  
  for (i = 0; i < num_coords; i = i + 1) {
    iVar3 = x + coords[i][0];
    iVar4 = y + coords[i][1];
    buffer[i] = (double)data[iVar4 * stride + iVar3] - (double)denoised[iVar4 * stride + iVar3];
  }
  uVar1 = data[y * stride + x];
  uVar2 = denoised[y * stride + x];
  if ((alt_data != (uint16_t *)0x0) && (alt_denoised != (uint16_t *)0x0)) {
    avg_data = 0.0;
    avg_denoised = 0.0;
    num_samples = 0;
    for (dy_i = 0; dy_i < 1 << ((byte)sub_log2[1] & 0x1f); dy_i = dy_i + 1) {
      iVar3 = (y << ((byte)sub_log2[1] & 0x1f)) + dy_i;
      for (dx_i = 0; dx_i < 1 << ((byte)*sub_log2 & 0x1f); dx_i = dx_i + 1) {
        iVar4 = (x << ((byte)*sub_log2 & 0x1f)) + dx_i;
        avg_data = (double)alt_data[iVar3 * alt_stride + iVar4] + avg_data;
        avg_denoised = (double)alt_denoised[iVar3 * alt_stride + iVar4] + avg_denoised;
        num_samples = num_samples + 1;
      }
    }
    buffer[num_coords] = (avg_data - avg_denoised) / (double)num_samples;
  }
  return (double)uVar1 - (double)uVar2;
}

Assistant:

static int add_block_observations(
    aom_noise_model_t *noise_model, int c, const uint8_t *const data,
    const uint8_t *const denoised, int w, int h, int stride, int sub_log2[2],
    const uint8_t *const alt_data, const uint8_t *const alt_denoised,
    int alt_stride, const uint8_t *const flat_blocks, int block_size,
    int num_blocks_w, int num_blocks_h) {
  const int lag = noise_model->params.lag;
  const int num_coords = noise_model->n;
  const double normalization = (1 << noise_model->params.bit_depth) - 1;
  double *A = noise_model->latest_state[c].eqns.A;
  double *b = noise_model->latest_state[c].eqns.b;
  double *buffer = (double *)aom_malloc(sizeof(*buffer) * (num_coords + 1));
  const int n = noise_model->latest_state[c].eqns.n;

  if (!buffer) {
    fprintf(stderr, "Unable to allocate buffer of size %d\n", num_coords + 1);
    return 0;
  }
  for (int by = 0; by < num_blocks_h; ++by) {
    const int y_o = by * (block_size >> sub_log2[1]);
    for (int bx = 0; bx < num_blocks_w; ++bx) {
      const int x_o = bx * (block_size >> sub_log2[0]);
      if (!flat_blocks[by * num_blocks_w + bx]) {
        continue;
      }
      int y_start =
          (by > 0 && flat_blocks[(by - 1) * num_blocks_w + bx]) ? 0 : lag;
      int x_start =
          (bx > 0 && flat_blocks[by * num_blocks_w + bx - 1]) ? 0 : lag;
      int y_end = AOMMIN((h >> sub_log2[1]) - by * (block_size >> sub_log2[1]),
                         block_size >> sub_log2[1]);
      int x_end = AOMMIN(
          (w >> sub_log2[0]) - bx * (block_size >> sub_log2[0]) - lag,
          (bx + 1 < num_blocks_w && flat_blocks[by * num_blocks_w + bx + 1])
              ? (block_size >> sub_log2[0])
              : ((block_size >> sub_log2[0]) - lag));
      for (int y = y_start; y < y_end; ++y) {
        for (int x = x_start; x < x_end; ++x) {
          const double val =
              noise_model->params.use_highbd
                  ? extract_ar_row_highbd(noise_model->coords, num_coords,
                                          (const uint16_t *const)data,
                                          (const uint16_t *const)denoised,
                                          stride, sub_log2,
                                          (const uint16_t *const)alt_data,
                                          (const uint16_t *const)alt_denoised,
                                          alt_stride, x + x_o, y + y_o, buffer)
                  : extract_ar_row_lowbd(noise_model->coords, num_coords, data,
                                         denoised, stride, sub_log2, alt_data,
                                         alt_denoised, alt_stride, x + x_o,
                                         y + y_o, buffer);
          for (int i = 0; i < n; ++i) {
            for (int j = 0; j < n; ++j) {
              A[i * n + j] +=
                  (buffer[i] * buffer[j]) / (normalization * normalization);
            }
            b[i] += (buffer[i] * val) / (normalization * normalization);
          }
          noise_model->latest_state[c].num_observations++;
        }
      }
    }
  }
  aom_free(buffer);
  return 1;
}